

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::btranAPF(HFactor *this,HVector *vector)

{
  HighsInt *rhs_index;
  double *rhs_array;
  pointer piVar1;
  ulong uVar2;
  uint uVar3;
  HighsInt rhs_count;
  HVector *local_38;
  
  rhs_count = vector->count;
  uVar3 = (uint)((ulong)((long)(this->pf_pivot_value).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->pf_pivot_value).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  local_38 = vector;
  if (0 < (int)uVar3) {
    rhs_index = (vector->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    rhs_array = (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      piVar1 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      solveMatrixT(piVar1[uVar2 * 2],piVar1[uVar2 * 2 + 1],piVar1[uVar2 * 2 + 1],
                   piVar1[uVar2 * 2 + 2],
                   (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar2],&rhs_count,rhs_index,rhs_array);
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar2);
  }
  local_38->count = rhs_count;
  return;
}

Assistant:

void HFactor::btranAPF(HVector& vector) const {
  // Alias to non constant
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();

  // Forwardly
  HighsInt pf_pivot_count = pf_pivot_value.size();
  for (HighsInt i = 0; i < pf_pivot_count; i++) {
    solveMatrixT(pf_start[i * 2], pf_start[i * 2 + 1], pf_start[i * 2 + 1],
                 pf_start[i * 2 + 2], pf_index.data(), pf_value.data(),
                 pf_pivot_value[i], &rhs_count, rhs_index, rhs_array);
  }
  vector.count = rhs_count;
}